

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper * __thiscall
Js::JavascriptLibrary::CreateAlreadyDefinedWrapper_TTD(JavascriptLibrary *this,bool alreadyDefined)

{
  ScriptContext *this_00;
  Recycler *pRVar1;
  JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper *pJVar2;
  TrackAllocData local_48;
  JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper *alreadyResolvedRecord;
  JavascriptLibrary *pJStack_10;
  bool alreadyDefined_local;
  JavascriptLibrary *this_local;
  
  alreadyResolvedRecord._7_1_ = alreadyDefined;
  pJStack_10 = this;
  this_00 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                      (&(this->super_JavascriptLibraryBase).scriptContext);
  pRVar1 = ScriptContext::GetRecycler(this_00);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,
             (type_info *)&JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper::typeinfo,
             0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
             ,0x1601);
  pRVar1 = Memory::Recycler::TrackAllocInfo(pRVar1,&local_48);
  pJVar2 = (JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper *)
           new<Memory::Recycler>(1,pRVar1,0x744a10);
  pJVar2->alreadyResolved = (Type)(alreadyResolvedRecord._7_1_ & 1);
  return pJVar2;
}

Assistant:

JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper* JavascriptLibrary::CreateAlreadyDefinedWrapper_TTD(bool alreadyDefined)
    {
        JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper* alreadyResolvedRecord = RecyclerNewStructZ(scriptContext->GetRecycler(), JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper);
        alreadyResolvedRecord->alreadyResolved = alreadyDefined;

        return alreadyResolvedRecord;
    }